

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

int glob_match_url(char **result,char *filename,URLGlob *glob)

{
  undefined4 *puVar1;
  URLPatternType UVar2;
  anon_union_24_3_e2f18bb4_for_content *paVar3;
  undefined4 uVar4;
  URLGlob *pUVar5;
  ushort **ppuVar6;
  ulong uVar7;
  void *pvVar8;
  char *newstr;
  URLPattern pat;
  unsigned_long num;
  char *ptr;
  unsigned_long i;
  size_t stringlen;
  size_t appendlen;
  char *appendthis;
  char numbuf [18];
  ulong local_38;
  size_t allocsize;
  char *target;
  URLGlob *glob_local;
  char *filename_local;
  char **result_local;
  
  appendlen = 0;
  stringlen = 0;
  i = 0;
  *result = (char *)0x0;
  glob_local = (URLGlob *)filename;
  filename_local = (char *)result;
  local_38 = strlen(filename);
  local_38 = local_38 + 1;
  allocsize = (size_t)malloc(local_38);
  if ((void *)allocsize == (void *)0x0) {
    result_local._4_4_ = 0x1b;
  }
  else {
    while (*(char *)glob_local->literal != '\0') {
      if ((*(char *)glob_local->literal == '#') &&
         (ppuVar6 = __ctype_b_loc(), pUVar5 = glob_local,
         ((*ppuVar6)[(int)(uint)*(byte *)((long)glob_local->literal + 1)] & 0x800) != 0)) {
        uVar7 = strtoul((char *)((long)glob_local->literal + 1),(char **)&glob_local,10);
        if ((uVar7 == 0) || (glob->size >> 1 < uVar7 - 1)) {
          glob_local = (URLGlob *)((long)pUVar5->literal + 1);
          appendlen = (size_t)pUVar5;
          stringlen = 1;
        }
        else {
          UVar2 = glob->pattern[uVar7 - 1].type;
          paVar3 = &glob->pattern[uVar7 - 1].content;
          puVar1 = (undefined4 *)((long)&glob->pattern[uVar7 - 1].content + 8);
          uVar4 = *puVar1;
          pat.type._2_1_ = (undefined1)((uint)(paVar3->NumRange).min_n >> 0x10);
          if (UVar2 == UPTSet) {
            if ((paVar3->Set).elements != (char **)0x0) {
              pat.content.NumRange.min_n._2_2_ = (undefined2)((uint)uVar4 >> 0x10);
              appendlen = (size_t)(paVar3->Set).elements[(short)pat.content.NumRange.min_n._2_2_];
              stringlen = strlen((paVar3->Set).elements[(short)pat.content.NumRange.min_n._2_2_]);
            }
          }
          else if (UVar2 == UPTCharRange) {
            appendthis._0_1_ = pat.type._2_1_;
            appendthis._1_1_ = 0;
            appendlen = (size_t)&appendthis;
            stringlen = 1;
          }
          else {
            if (UVar2 != UPTNumRange) {
              curl_mprintf("internal error: invalid pattern type (%d)\n",UVar2);
              if (allocsize != 0) {
                free((void *)allocsize);
              }
              return 2;
            }
            pat.content.NumRange.min_n._0_2_ = (undefined2)uVar4;
            curl_msnprintf(&appendthis,0x12,"%0*d",(int)(short)pat.content.NumRange.min_n._0_2_,
                           puVar1[1]);
            appendlen = (size_t)&appendthis;
            stringlen = strlen((char *)&appendthis);
          }
        }
      }
      else {
        appendlen = (size_t)glob_local;
        stringlen = 1;
        glob_local = (URLGlob *)((long)glob_local->literal + 1);
      }
      pvVar8 = (void *)allocsize;
      if (local_38 <= stringlen + i) {
        local_38 = (stringlen + i) * 2;
        pvVar8 = realloc((void *)allocsize,local_38 + 1);
        if (pvVar8 == (void *)0x0) {
          if (allocsize != 0) {
            free((void *)allocsize);
          }
          return 0x1b;
        }
      }
      allocsize = (size_t)pvVar8;
      memcpy((void *)(allocsize + i),(void *)appendlen,stringlen);
      i = stringlen + i;
    }
    *(undefined1 *)(allocsize + i) = 0;
    *(size_t *)filename_local = allocsize;
    result_local._4_4_ = 0;
  }
  return result_local._4_4_;
}

Assistant:

int glob_match_url(char **result, char *filename, URLGlob *glob)
{
  char *target;
  size_t allocsize;
  char numbuf[18];
  char *appendthis = NULL;
  size_t appendlen = 0;
  size_t stringlen = 0;

  *result = NULL;

  /* We cannot use the glob_buffer for storage here since the filename may
   * be longer than the URL we use. We allocate a good start size, then
   * we need to realloc in case of need.
   */
  allocsize = strlen(filename) + 1; /* make it at least one byte to store the
                                       trailing zero */
  target = malloc(allocsize);
  if(!target)
    return CURLE_OUT_OF_MEMORY;

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      unsigned long i;
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      i = num - 1UL;

      if(num && (i <= glob->size / 2)) {
        URLPattern pat = glob->pattern[i];
        switch (pat.type) {
        case UPTSet:
          if(pat.content.Set.elements) {
            appendthis = pat.content.Set.elements[pat.content.Set.ptr_s];
            appendlen =
              strlen(pat.content.Set.elements[pat.content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat.content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          snprintf(numbuf, sizeof(numbuf), "%0*d",
                   pat.content.NumRange.padlength,
                   pat.content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          printf("internal error: invalid pattern type (%d)\n",
                 (int)pat.type);
          Curl_safefree(target);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(appendlen + stringlen >= allocsize) {
      char *newstr;
      /* we append a single byte to allow for the trailing byte to be appended
         at the end of this function outside the while() loop */
      allocsize = (appendlen + stringlen) * 2;
      newstr = realloc(target, allocsize + 1);
      if(!newstr) {
        Curl_safefree(target);
        return CURLE_OUT_OF_MEMORY;
      }
      target = newstr;
    }
    memcpy(&target[stringlen], appendthis, appendlen);
    stringlen += appendlen;
  }
  target[stringlen]= '\0';
  *result = target;
  return CURLE_OK;
}